

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptor::FindEnumValueByName(FileDescriptor *this,string *key)

{
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar1;
  Symbol SVar2;
  
  SVar2 = FileDescriptorTables::FindNestedSymbolOfType
                    (*(FileDescriptorTables **)(this + 0x90),this,key,ENUM_VALUE);
  aVar1.descriptor = (Descriptor *)0x0;
  if (SVar2.type != NULL_SYMBOL) {
    aVar1 = SVar2.field_1;
  }
  return (EnumValueDescriptor *)aVar1.descriptor;
}

Assistant:

const EnumValueDescriptor*
FileDescriptor::FindEnumValueByName(const string& key) const {
  Symbol result =
    tables_->FindNestedSymbolOfType(this, key, Symbol::ENUM_VALUE);
  if (!result.IsNull()) {
    return result.enum_value_descriptor;
  } else {
    return NULL;
  }
}